

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

void Error::setErrorString(String *error)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  Iterator *pIVar5;
  uint *puVar6;
  undefined4 extraout_var;
  Str local_f0 [2];
  Str local_d0;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  cpu_set_t cpuset;
  Iterator next;
  Iterator end;
  Iterator i;
  Str *threadErrorMsg;
  String *pSStack_10;
  uint32 threadId;
  String *error_local;
  
  pSStack_10 = error;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&Private::mutex);
  if ((iVar3 != 0) &&
     (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Error.cpp"
                            ,0xa4,"pthread_mutex_lock(&Private::mutex) == 0"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  lVar4 = syscall(0xba);
  threadErrorMsg._4_4_ = (uint)lVar4;
  i.item = (Item *)0x0;
  pIVar5 = Map<unsigned_int,_Error::Private::Str>::begin(&Private::userErrorStrings);
  end.item = pIVar5->item;
  pIVar5 = Map<unsigned_int,_Error::Private::Str>::end(&Private::userErrorStrings);
  next.item = pIVar5->item;
  Map<unsigned_int,_Error::Private::Str>::Iterator::Iterator((Iterator *)(cpuset.__bits + 0xf));
  while (bVar2 = Map<unsigned_int,_Error::Private::Str>::Iterator::operator!=(&end,&next), bVar2) {
    cpuset.__bits[0xf] = (__cpu_mask)end.item;
    Map<unsigned_int,_Error::Private::Str>::Iterator::operator++((Iterator *)(cpuset.__bits + 0xf));
    puVar6 = Map<unsigned_int,_Error::Private::Str>::Iterator::key(&end);
    iVar3 = sched_getaffinity(*puVar6,0x80,(cpu_set_t *)local_b8);
    if (iVar3 == 0) {
      puVar6 = Map<unsigned_int,_Error::Private::Str>::Iterator::key(&end);
      if (*puVar6 == threadErrorMsg._4_4_) {
        i.item = (Item *)Map<unsigned_int,_Error::Private::Str>::Iterator::operator*(&end);
      }
    }
    else {
      iVar3 = Map<unsigned_int,_Error::Private::Str>::remove
                        (&Private::userErrorStrings,(char *)&end);
      local_c0 = CONCAT44(extraout_var,iVar3);
    }
    end.item = (Item *)cpuset.__bits[0xf];
  }
  if (i.item == (Item *)0x0) {
    Private::Str::Str(local_f0,pSStack_10);
    Map<unsigned_int,_Error::Private::Str>::insert
              (&Private::userErrorStrings,(uint *)((long)&threadErrorMsg + 4),local_f0);
    Private::Str::~Str(local_f0);
  }
  else {
    Private::Str::Str(&local_d0,pSStack_10);
    Private::Str::operator=((Str *)i.item,&local_d0);
    Private::Str::~Str(&local_d0);
  }
  setLastError(0x10000);
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&Private::mutex);
  if ((iVar3 != 0) &&
     (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Error.cpp"
                            ,0xcf,"pthread_mutex_unlock(&Private::mutex) == 0"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return;
}

Assistant:

void Error::setErrorString(const String& error)
{
#ifdef _WIN32
  EnterCriticalSection(&Private::cs);
#else
  VERIFY(pthread_mutex_lock(&Private::mutex) == 0);
#endif

#ifdef _WIN32
  uint32 threadId = (uint32)GetCurrentThreadId();
#else
  uint32 threadId = (uint32)syscall(__NR_gettid);
#endif

  Error::Private::Str* threadErrorMsg = 0;
  for(Map<uint32, Error::Private::Str>::Iterator i = Private::userErrorStrings.begin(), end = Private::userErrorStrings.end(), next; i != end; i = next)
  {
    next = i;
    ++next;

#ifdef _WIN32
    HANDLE handle = OpenThread(DELETE, FALSE, i.key());
    if(handle == NULL)
    {
      Private::userErrorStrings.remove(i);
      continue;
    }
    else
      CloseHandle(handle);
#else
    cpu_set_t cpuset;
    if(sched_getaffinity((pid_t)i.key(), sizeof(cpu_set_t), &cpuset) != 0)
    {
      Private::userErrorStrings.remove(i);
      continue;
    }
#endif
    if(i.key() == threadId)
      threadErrorMsg = &*i;
  }
  if(threadErrorMsg)
    *threadErrorMsg = error;
  else
    Private::userErrorStrings.insert(threadId, error);
  setLastError(0x10000);
#ifdef _WIN32
  LeaveCriticalSection(&Private::cs);
#else
  VERIFY(pthread_mutex_unlock(&Private::mutex) == 0);
#endif
}